

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

int ip_address_from_container(char *container_id,char **ip_address_out)

{
  int iVar1;
  char *pcVar2;
  uint local_30;
  int ret;
  int wait_time;
  int attempt_no;
  char *active_docker_machine;
  char **ip_address_out_local;
  char *container_id_local;
  
  pcVar2 = docker_machine_name();
  if (pcVar2 == (char *)0x0) {
    iVar1 = is_running_inside_a_container();
    if (iVar1 == 0) {
      container_id_local._4_4_ =
           run_command(ip_address_out,
                       "docker inspect --format \"{{ index (index (index .NetworkSettings.Ports \\\"22/tcp\\\") 0) \\\"HostIp\\\" }}\" %s"
                       ,container_id);
    }
    else {
      container_id_local._4_4_ =
           run_command(ip_address_out,
                       "docker inspect --format \"{{ .NetworkSettings.IPAddress }}\" %s",
                       container_id);
    }
  }
  else {
    ret = 0;
    local_30 = 500;
    while (iVar1 = run_command(ip_address_out,"docker-machine ip %s",pcVar2), iVar1 != 0) {
      if (5 < ret) {
        fprintf(_stderr,"Unable to get IP from docker-machine after %d attempts\n",(ulong)(uint)ret)
        ;
        return -1;
      }
      portable_sleep(local_30);
      ret = ret + 1;
      local_30 = local_30 << 1;
    }
    container_id_local._4_4_ = 0;
  }
  return container_id_local._4_4_;
}

Assistant:

static int ip_address_from_container(char *container_id, char **ip_address_out)
{
    const char *active_docker_machine = docker_machine_name();
    if(active_docker_machine) {

        /* This can be flaky when tests run in parallel (see
           https://github.com/docker/machine/issues/2612), so we retry a few
           times with exponential backoff if it fails */
        int attempt_no = 0;
        int wait_time = 500;
        for(;;) {
            int ret = run_command(ip_address_out, "docker-machine ip %s",
                                  active_docker_machine);
            if(ret == 0) {
                return 0;
            }
            else if(attempt_no > 5) {
                fprintf(
                    stderr,
                    "Unable to get IP from docker-machine after %d attempts\n",
                    attempt_no);
                return -1;
            }
            else {
                portable_sleep(wait_time);
                ++attempt_no;
                wait_time *= 2;
            }
        }
    }
    else {
        if(is_running_inside_a_container()) {
            return run_command(ip_address_out,
                               "docker inspect --format "
                               "\"{{ .NetworkSettings.IPAddress }}\""
                               " %s",
                               container_id);
        }
        else {
            return run_command(ip_address_out,
                               "docker inspect --format "
                               "\"{{ index (index (index "
                               ".NetworkSettings.Ports "
                               "\\\"22/tcp\\\") 0) \\\"HostIp\\\" }}\" %s",
                               container_id);
        }
    }
}